

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode baller_start(Curl_cfilter *cf,Curl_easy *data,eyeballer *baller,timediff_t timeoutms)

{
  Curl_cfilter **pcf;
  CURLcode CVar1;
  Curl_cfilter *in_RAX;
  Curl_cftype *pCVar2;
  Curl_cfilter *pCVar3;
  Curl_cftype *extraout_RAX;
  Curl_cftype *extraout_RAX_00;
  Curl_cftype *extraout_RAX_01;
  Curl_cftype *extraout_RAX_02;
  byte bVar4;
  Curl_addrinfo *pCVar5;
  curltime cVar6;
  Curl_cfilter *local_38;
  
  baller->error = 0;
  pCVar2 = (Curl_cftype *)
           (CONCAT71((int7)((ulong)in_RAX >> 8),baller->field_0x64) & 0xfffffffffffffff5 | 2);
  baller->field_0x64 = (char)pCVar2;
  if (baller->addr != (Curl_addrinfo *)0x0) {
    pcf = &baller->cf;
    local_38 = in_RAX;
    do {
      cVar6 = Curl_now();
      (baller->started).tv_sec = cVar6.tv_sec;
      (baller->started).tv_usec = cVar6.tv_usec;
      pCVar5 = baller->addr;
      do {
        if ((pCVar5 == (Curl_addrinfo *)0x0) ||
           (pCVar5 = pCVar5->ai_next, pCVar5 == (Curl_addrinfo *)0x0)) {
          bVar4 = 0;
          goto LAB_0011d180;
        }
      } while (pCVar5->ai_family != baller->ai_family);
      bVar4 = 1;
LAB_0011d180:
      baller->timeoutms = (ulong)timeoutms >> (600 < timeoutms & bVar4);
      local_38 = baller->cf;
      CVar1 = (*baller->cf_create)(pcf,data,cf->conn,baller->addr,*cf->ctx);
      pCVar2 = (Curl_cftype *)(ulong)CVar1;
      if (CVar1 == CURLE_OK) {
        for (pCVar3 = *pcf; pCVar3 != (Curl_cfilter *)0x0; pCVar3 = pCVar3->next) {
          pCVar3->conn = cf->conn;
          pCVar3->sockindex = cf->sockindex;
        }
        pCVar2 = (Curl_cftype *)baller->addr;
        do {
          if ((pCVar2 == (Curl_cftype *)0x0) ||
             (pCVar2 = (Curl_cftype *)pCVar2->do_shutdown, pCVar2 == (Curl_cftype *)0x0))
          goto LAB_0011d270;
        } while (*(int *)((long)&pCVar2->name + 4) != baller->ai_family);
        Curl_expire(data,baller->timeoutms,baller->timeout_id);
        pCVar2 = extraout_RAX;
      }
      else {
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
          pCVar2 = (Curl_cftype *)(data->state).feat;
          if (pCVar2 == (Curl_cftype *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_0011d23d;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pCVar2->flags)) {
LAB_0011d23d:
            pCVar2 = cf->cft;
            if (0 < pCVar2->log_level) {
              Curl_trc_cf_infof(data,cf,"%s failed",baller->name);
              pCVar2 = extraout_RAX_00;
            }
          }
        }
        if (*pcf != (Curl_cfilter *)0x0) {
          Curl_conn_cf_discard_chain(pcf,data);
          pCVar2 = extraout_RAX_01;
        }
      }
LAB_0011d270:
      if (local_38 != (Curl_cfilter *)0x0) {
        Curl_conn_cf_discard_chain(&local_38,data);
        pCVar2 = extraout_RAX_02;
      }
      baller->result = CVar1;
      if (CVar1 == CURLE_OK) break;
      pCVar2 = (Curl_cftype *)baller->addr;
      do {
        if ((pCVar2 == (Curl_cftype *)0x0) ||
           (pCVar2 = (Curl_cftype *)pCVar2->do_shutdown, pCVar2 == (Curl_cftype *)0x0)) {
          pCVar2 = (Curl_cftype *)0x0;
          break;
        }
      } while (*(int *)((long)&pCVar2->name + 4) != baller->ai_family);
      baller->addr = (Curl_addrinfo *)pCVar2;
    } while (pCVar2 != (Curl_cftype *)0x0);
  }
  if (baller->addr == (Curl_addrinfo *)0x0) {
    baller->field_0x64 = baller->field_0x64 | 4;
  }
  return (CURLcode)pCVar2;
}

Assistant:

static CURLcode baller_start(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             struct eyeballer *baller,
                             timediff_t timeoutms)
{
  baller->error = 0;
  baller->connected = FALSE;
  baller->has_started = TRUE;

  while(baller->addr) {
    baller->started = Curl_now();
    baller->timeoutms = addr_next_match(baller->addr, baller->ai_family) ?
      USETIME(timeoutms) : timeoutms;
    baller_initiate(cf, data, baller);
    if(!baller->result)
      break;
    baller_next_addr(baller);
  }
  if(!baller->addr) {
    baller->is_done = TRUE;
  }
  return baller->result;
}